

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O3

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitMinus
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,UnaryExpr e)

{
  Buffer<char> *pBVar1;
  size_t sVar2;
  
  pBVar1 = this->writer_->buffer_;
  sVar2 = pBVar1->size_;
  if (sVar2 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar2 + 1);
    sVar2 = pBVar1->size_;
  }
  pBVar1->size_ = sVar2 + 1;
  pBVar1->ptr_[sVar2] = '-';
  Visit(this,(NumericExpr)
             ((ExprBase *)
             ((long)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_ +
             8))->impl_,-1);
  return;
}

Assistant:

void VisitMinus(UnaryExpr e) {
    writer_ << '-';
    Visit(e.arg());
  }